

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

intptr_t fio_listen(fio_listen_args args)

{
  size_t sVar1;
  int64_t iVar2;
  int *piVar3;
  intptr_t iVar4;
  undefined8 *arg;
  uintptr_t uVar5;
  code *pcVar6;
  char *format;
  long in_stack_00000008;
  char *in_stack_00000010;
  char *in_stack_00000018;
  char *tmp;
  undefined8 in_stack_00000028;
  undefined8 in_stack_00000030;
  code *in_stack_00000038;
  size_t local_58;
  char *local_38;
  
  if (((in_stack_00000008 == 0) &&
      ((tmp == (char *)0x0 || (uVar5 = fio_tls_alpn_count(tmp), uVar5 == 0)))) ||
     (in_stack_00000018 == (char *)0x0 && in_stack_00000010 == (char *)0x0)) {
LAB_0010b088:
    piVar3 = __errno_location();
    *piVar3 = 0x16;
  }
  else {
    if (in_stack_00000018 == (char *)0x0) {
      sVar1 = 0;
    }
    else {
      sVar1 = strlen(in_stack_00000018);
    }
    if (in_stack_00000010 == (char *)0x0) {
      local_58 = 0;
    }
    else {
      local_58 = strlen(in_stack_00000010);
      local_38 = in_stack_00000010;
      iVar2 = fio_atol(&local_38);
      if (iVar2 == 0) {
        in_stack_00000010 = (char *)0x0;
        local_58 = 0;
      }
      if (*local_38 != '\0') goto LAB_0010b088;
    }
    iVar4 = fio_socket(in_stack_00000018,in_stack_00000010,'\x01');
    if (iVar4 != -1) {
      arg = (undefined8 *)malloc((ulong)(sVar1 + local_58 != 0) * 2 + 0x80 + sVar1 + local_58);
      if (arg == (undefined8 *)0x0) {
        if (0 < FIO_LOG_LEVEL) {
          FIO_LOG2STDERR(
                        "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/facil/lib/facil/fio.c:4594"
                        );
        }
        kill(0,2);
        piVar3 = __errno_location();
        exit(*piVar3);
      }
      if (tmp == (char *)0x0) {
        pcVar6 = fio_listen_on_data;
      }
      else {
        fio_tls_dup(tmp);
        uVar5 = fio_tls_alpn_count(tmp);
        pcVar6 = fio_listen_on_data_tls_alpn;
        if (uVar5 == 0) {
          pcVar6 = fio_listen_on_data_tls;
        }
      }
      *arg = pcVar6;
      arg[1] = 0;
      arg[2] = 0;
      arg[3] = fio_listen_on_close;
      arg[4] = mock_ping_eternal;
      arg[5] = 0;
      arg[6] = iVar4;
      arg[7] = in_stack_00000028;
      arg[8] = in_stack_00000008;
      arg[9] = in_stack_00000030;
      arg[10] = in_stack_00000038;
      arg[0xb] = (long)arg + sVar1 + 0x81;
      arg[0xc] = arg + 0x10;
      arg[0xd] = local_58;
      arg[0xe] = sVar1;
      arg[0xf] = tmp;
      if (sVar1 != 0) {
        memcpy(arg + 0x10,in_stack_00000018,sVar1 + 1);
      }
      if (local_58 != 0) {
        memcpy((void *)arg[0xb],in_stack_00000010,local_58 + 1);
      }
      if ((fio_data == (fio_data_s *)0x0) || (fio_data->active == '\0')) {
        fio_state_callback_add(FIO_CALL_ON_START,fio_listen_on_startup,arg);
        fio_state_callback_add(FIO_CALL_ON_SHUTDOWN,fio_listen_cleanup_task,arg);
      }
      else {
        fio_attach__internal((void *)arg[6],arg);
      }
      if (in_stack_00000010 == (char *)0x0) {
        if (FIO_LOG_LEVEL < 4) {
          return iVar4;
        }
        format = "INFO: Listening on Unix Socket at %s";
        in_stack_00000010 = in_stack_00000018;
      }
      else {
        if (FIO_LOG_LEVEL < 4) {
          return iVar4;
        }
        format = "INFO: Listening on port %s";
      }
      FIO_LOG2STDERR(format,in_stack_00000010);
      return iVar4;
    }
  }
  if (in_stack_00000038 != (code *)0x0) {
    (*in_stack_00000038)(0xffffffffffffffff,in_stack_00000028);
  }
  return -1;
}

Assistant:

intptr_t fio_listen FIO_IGNORE_MACRO(struct fio_listen_args args) {
  // ...
  if ((!args.on_open && (!args.tls || !fio_tls_alpn_count(args.tls))) ||
      (!args.address && !args.port)) {
    errno = EINVAL;
    goto error;
  }

  size_t addr_len = 0;
  size_t port_len = 0;
  if (args.address)
    addr_len = strlen(args.address);
  if (args.port) {
    port_len = strlen(args.port);
    char *tmp = (char *)args.port;
    if (!fio_atol(&tmp)) {
      port_len = 0;
      args.port = NULL;
    }
    if (*tmp) {
      /* port format was invalid, should be only numerals */
      errno = EINVAL;
      goto error;
    }
  }
  const intptr_t uuid = fio_socket(args.address, args.port, 1);
  if (uuid == -1)
    goto error;

  fio_listen_protocol_s *pr = malloc(sizeof(*pr) + addr_len + port_len +
                                     ((addr_len + port_len) ? 2 : 0));
  FIO_ASSERT_ALLOC(pr);

  if (args.tls)
    fio_tls_dup(args.tls);

  *pr = (fio_listen_protocol_s){
      .pr =
          {
              .on_close = fio_listen_on_close,
              .ping = mock_ping_eternal,
              .on_data = (args.tls ? (fio_tls_alpn_count(args.tls)
                                          ? fio_listen_on_data_tls_alpn
                                          : fio_listen_on_data_tls)
                                   : fio_listen_on_data),
          },
      .uuid = uuid,
      .udata = args.udata,
      .on_open = args.on_open,
      .on_start = args.on_start,
      .on_finish = args.on_finish,
      .tls = args.tls,
      .addr_len = addr_len,
      .port_len = port_len,
      .addr = (char *)(pr + 1),
      .port = ((char *)(pr + 1) + addr_len + 1),
  };

  if (addr_len)
    memcpy(pr->addr, args.address, addr_len + 1);
  if (port_len)
    memcpy(pr->port, args.port, port_len + 1);

  if (fio_is_running()) {
    fio_attach(pr->uuid, &pr->pr);
  } else {
    fio_state_callback_add(FIO_CALL_ON_START, fio_listen_on_startup, pr);
    fio_state_callback_add(FIO_CALL_ON_SHUTDOWN, fio_listen_cleanup_task, pr);
  }

  if (args.port)
    FIO_LOG_INFO("Listening on port %s", args.port);
  else
    FIO_LOG_INFO("Listening on Unix Socket at %s", args.address);

  return uuid;
error:
  if (args.on_finish) {
    args.on_finish(-1, args.udata);
  }
  return -1;
}